

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O0

void __thiscall
nuraft::peer::send_req(peer *this,ptr<peer> *myself,ptr<req_msg> *req,rpc_handler *handler)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *this_00;
  element_type *peVar4;
  undefined8 uVar5;
  element_type *peVar6;
  element_type *peVar7;
  __shared_ptr *in_RDX;
  shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>
  *in_RSI;
  _Placeholder<1> *in_RDI;
  rpc_handler h;
  lock_guard<std::mutex> l;
  ptr<rpc_client> rpc_local;
  ptr<rpc_result> pending;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffffe28;
  shared_ptr<nuraft::rpc_client> *in_stack_fffffffffffffe30;
  atomic<bool> *in_stack_fffffffffffffe38;
  _Bind<void_(nuraft::peer::*(nuraft::peer_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *__f;
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  *in_stack_fffffffffffffe40;
  shared_ptr<nuraft::req_msg> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  shared_ptr<nuraft::peer> *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  undefined1 local_100 [36];
  int local_dc;
  string local_d8 [40];
  __shared_ptr local_b0 [32];
  string local_90 [32];
  string local_70 [12];
  msg_type in_stack_ffffffffffffff9c;
  string local_40 [40];
  __shared_ptr *local_18;
  
  local_18 = in_RDX;
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffe38);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0));
    if (bVar1) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1cb079);
      iVar3 = (*peVar6->_vptr_logger[7])();
      if (1 < iVar3) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cb09c);
        this_00 = std::
                  __shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1cb0ab);
        uVar2 = srv_config::get_id(this_00);
        msg_if_given_abi_cxx11_
                  ((char *)local_40,"peer %d has been shut down, cannot send request",(ulong)uVar2);
        (*peVar6->_vptr_logger[8])
                  (peVar6,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                   ,"send_req",0x24,local_40);
        std::__cxx11::string::~string(local_40);
      }
    }
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
    if ((bVar1) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0)), bVar1))
    {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1cb179);
      iVar3 = (*peVar6->_vptr_logger[7])();
      if (5 < iVar3) {
        in_stack_fffffffffffffe58 =
             (shared_ptr<nuraft::peer> *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1cb19c);
        peVar4 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cb1ae);
        in_stack_fffffffffffffe68 = msg_base::get_src(&peVar4->super_msg_base);
        peVar4 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cb1c7);
        in_stack_fffffffffffffe6c = msg_base::get_dst(&peVar4->super_msg_base);
        peVar4 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cb1e0);
        msg_base::get_type(&peVar4->super_msg_base);
        in_stack_fffffffffffffe60 = local_90;
        msg_type_to_string_abi_cxx11_(in_stack_ffffffffffffff9c);
        uVar5 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_70,"send req %d -> %d, type %s",(ulong)in_stack_fffffffffffffe68,
                   (ulong)in_stack_fffffffffffffe6c,uVar5);
        (**(code **)((long)&(((in_stack_fffffffffffffe58->
                              super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                            ->rpc_protector_).super___mutex_base._M_mutex + 0x10))
                  (in_stack_fffffffffffffe58,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                   ,"send_req",0x2c,local_70);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_90);
      }
    }
    cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&>
              (in_stack_fffffffffffffe28);
    std::shared_ptr<nuraft::rpc_client>::shared_ptr
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffe30,
               (mutex_type *)in_stack_fffffffffffffe28);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x20));
    if (bVar1) {
      std::shared_ptr<nuraft::rpc_client>::operator=
                (in_stack_fffffffffffffe30,
                 (shared_ptr<nuraft::rpc_client> *)in_stack_fffffffffffffe28);
      local_dc = 0;
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x2a0));
      if (bVar1) {
        peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1cb340);
        in_stack_fffffffffffffe54 = (*peVar6->_vptr_logger[7])();
        if (5 < in_stack_fffffffffffffe54) {
          in_stack_fffffffffffffe48 =
               (shared_ptr<nuraft::req_msg> *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1cb370);
          msg_if_given_abi_cxx11_((char *)local_d8,"rpc local is null");
          (*(code *)(((in_stack_fffffffffffffe48->
                      super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    log_entries_).
                    super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)
                    (in_stack_fffffffffffffe48,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                     ,"send_req",0x35,local_d8);
          std::__cxx11::string::~string(local_d8);
        }
      }
      set_free((peer *)0x1cb42f);
      local_dc = 1;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1cb46c);
    if (local_dc == 0) {
      __f = (_Bind<void_(nuraft::peer::*(nuraft::peer_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
             *)&std::placeholders::_2;
      std::
      bind<void(nuraft::peer::*)(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&),nuraft::peer*,std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((offset_in_peer_to_subr *)
                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (peer **)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                 (shared_ptr<nuraft::rpc_client> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48,in_RSI,in_RDI,(_Placeholder<2> *)in_RDI);
      std::
      function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
      function<std::_Bind<void(nuraft::peer::*(nuraft::peer*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
                (in_stack_fffffffffffffe40,__f);
      std::
      _Bind<void_(nuraft::peer::*(nuraft::peer_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::~_Bind((_Bind<void_(nuraft::peer::*(nuraft::peer_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)0x1cb512);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_b0);
      if (bVar1) {
        peVar7 = std::
                 __shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1cb535);
        (*peVar7->_vptr_rpc_client[2])(peVar7,local_18,local_100,0);
      }
      std::
      function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::~function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                   *)0x1cb5bc);
      local_dc = 0;
    }
    std::shared_ptr<nuraft::rpc_client>::~shared_ptr((shared_ptr<nuraft::rpc_client> *)0x1cb5d4);
    std::
    shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>
    ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>
                   *)0x1cb5e1);
  }
  return;
}

Assistant:

void peer::send_req( ptr<peer> myself,
                     ptr<req_msg>& req,
                     rpc_handler& handler )
{
    if (abandoned_) {
        p_er("peer %d has been shut down, cannot send request",
             config_->get_id());
        return;
    }

    if (req) {
        p_tr("send req %d -> %d, type %s",
             req->get_src(),
             req->get_dst(),
             msg_type_to_string( req->get_type() ).c_str() );
    }

    ptr<rpc_result> pending = cs_new<rpc_result>(handler);
    ptr<rpc_client> rpc_local = nullptr;
    {   std::lock_guard<std::mutex> l(rpc_protector_);
        if (!rpc_) {
            // Nothing will be sent, immediately free it
            // to serve next operation.
            p_tr("rpc local is null");
            set_free();
            return;
        }
        rpc_local = rpc_;
    }
    rpc_handler h = (rpc_handler)std::bind
                    ( &peer::handle_rpc_result,
                      this,
                      myself,
                      rpc_local,
                      req,
                      pending,
                      std::placeholders::_1,
                      std::placeholders::_2 );
    if (rpc_local) {
        rpc_local->send(req, h);
    }
}